

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printAssociativeContainer<QHash<QNetworkRequest::KnownHeaders,QVariant>>
          (QtPrivate *this,QDebug debug,char *which,
          QHash<QNetworkRequest::KnownHeaders,_QVariant> *c)

{
  char *pcVar1;
  QTextStream *pQVar2;
  undefined8 uVar3;
  QDebug this_00;
  ulong uVar4;
  storage_type *psVar5;
  ulong uVar6;
  storage_type *psVar7;
  Data *pDVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QDebugStateSaver saver;
  QDebug local_70;
  QDebug local_68;
  QTextStream *local_60;
  undefined1 *local_58;
  QDebug local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar2 = *(QTextStream **)debug.stream;
  pQVar2[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar7 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)0xffffffffffffffff;
    do {
      psVar7 = psVar5 + 1;
      pcVar1 = which + 1 + (long)psVar5;
      psVar5 = psVar7;
    } while (*pcVar1 != '\0');
  }
  QVar9.m_data = psVar7;
  QVar9.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar2,(QString *)local_50);
  if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
    UNLOCK();
    if (*(int *)local_50[0].stream == 0) {
      QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar2 = *(QTextStream **)debug.stream;
  QVar10.m_data = (storage_type *)0x1;
  QVar10.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<(pQVar2,(QString *)local_50);
  if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
    UNLOCK();
    if (*(int *)local_50[0].stream == 0) {
      QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pDVar8 = c->d;
  if (pDVar8 == (Data *)0x0) {
    pDVar8 = (Data *)0x0;
  }
  else if (pDVar8->spans->offsets[0] == 0xff) {
    uVar4 = 1;
    do {
      uVar6 = uVar4;
      if (pDVar8->numBuckets == uVar6) {
        pDVar8 = (Data *)0x0;
        uVar6 = 0;
        break;
      }
      uVar4 = uVar6 + 1;
    } while (pDVar8->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
    goto LAB_002004fe;
  }
  uVar6 = 0;
LAB_002004fe:
  if (uVar6 != 0 || pDVar8 != (Data *)0x0) {
    do {
      QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      local_70.stream = *debug.stream;
      *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
      qt_QMetaEnum_debugOperator
                (&local_68,(longlong)&local_70,
                 (QMetaObject *)
                 (ulong)*(uint *)pDVar8->spans[uVar6 >> 7].entries
                                 [pDVar8->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f]].storage.
                                 data,(char *)&QNetworkRequest::staticMetaObject);
      this_00.stream = local_68.stream;
      QVar11.m_data = (storage_type *)0x2;
      QVar11.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_50);
      if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
        UNLOCK();
        if (*(int *)local_50[0].stream == 0) {
          QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_68.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_68.stream,' ');
      }
      local_50[0].stream = local_68.stream;
      *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
      QVariant::qdebugHelper((Stream *)&local_60);
      QDebug::~QDebug(local_50);
      QTextStream::operator<<(local_60,')');
      if (local_60[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_60,' ');
      }
      QDebug::~QDebug((QDebug *)&local_60);
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug(&local_70);
      do {
        if (pDVar8->numBuckets - 1 == uVar6) {
          uVar6 = 0;
          pDVar8 = (Data *)0x0;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (pDVar8->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
    } while (uVar6 != 0 || pDVar8 != (Data *)0x0);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}